

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O0

void __thiscall cppcms::xss::rules::rules(rules *this,string *file_name)

{
  byte bVar1;
  bool bVar2;
  data *v_00;
  char *pcVar3;
  undefined8 uVar4;
  ostream *poVar5;
  string *error;
  string *in_RSI;
  copy_ptr<cppcms::xss::rules::data> *in_RDI;
  ostringstream ss;
  int line_number;
  ifstream f;
  value v;
  value *in_stack_000009a8;
  rules *in_stack_000009b0;
  string *in_stack_fffffffffffffbb8;
  cppcms_error *in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffbc8;
  undefined1 full;
  data *in_stack_fffffffffffffbd0;
  undefined7 in_stack_fffffffffffffbd8;
  undefined1 in_stack_fffffffffffffbdf;
  undefined7 in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc0f;
  ostringstream local_3d0 [376];
  int local_258;
  undefined1 local_251;
  long local_230 [68];
  string *local_10;
  
  full = (undefined1)((ulong)in_stack_fffffffffffffbc8 >> 0x38);
  local_10 = in_RSI;
  v_00 = (data *)operator_new(0xf8);
  data::data(in_stack_fffffffffffffbd0);
  booster::copy_ptr<cppcms::xss::rules::data>::copy_ptr(in_RDI,v_00);
  json::value::value((value *)0x457fa1);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_230,pcVar3,_S_in);
  bVar1 = std::ios::operator!((void *)((long)local_230 + *(long *)(local_230[0] + -0x18)));
  if ((bVar1 & 1) != 0) {
    local_251 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::operator+((char *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)v_00);
    cppcms_error::cppcms_error(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    local_251 = 0;
    __cxa_throw(uVar4,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
  }
  local_258 = 0;
  bVar2 = json::value::load((value *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                            (istream *)in_stack_fffffffffffffbd0,(bool)full,
                            (int *)in_stack_fffffffffffffbc0);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_3d0);
    poVar5 = std::operator<<((ostream *)local_3d0,"xss::rules: error parsing JSON file ");
    poVar5 = std::operator<<(poVar5,local_10);
    poVar5 = std::operator<<(poVar5," in line ");
    std::ostream::operator<<(poVar5,local_258);
    error = (string *)__cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    cppcms_error::cppcms_error((cppcms_error *)poVar5,error);
    __cxa_throw(error,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
  }
  anon_unknown_8::load_from_json(in_stack_000009b0,in_stack_000009a8);
  std::ifstream::~ifstream(local_230);
  json::value::~value((value *)0x4582b7);
  return;
}

Assistant:

rules::rules(std::string const &file_name) : d(new data())
	{
		json::value v;
		booster::nowide::ifstream f(file_name.c_str());
		if(!f) {
			throw cppcms_error("xss::rules: failed to open file: " + file_name);
		}
		int line_number = 0;
		if(!v.load(f,true,&line_number)) {
			std::ostringstream ss;
			ss << "xss::rules: error parsing JSON file " << file_name << " in line " << line_number;
			throw cppcms_error(ss.str());
		}
		load_from_json(*this,v);
	}